

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

ScopeInstance * __thiscall
Scope::Instantiate(ScopeInstance *__return_storage_ptr__,Scope *this,
                  vector<unsigned_int,_std::allocator<unsigned_int>_> *values)

{
  uint *puVar1;
  
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_SDT).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  for (puVar1 = (this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 != (this->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    Insert(__return_storage_ptr__,
           (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[*puVar1]);
  }
  return __return_storage_ptr__;
}

Assistant:

ScopeInstance Scope::Instantiate(const std::vector<Index>& values) const
{
    ScopeInstance instance;
    for (Scope::const_iterator it=begin();it!=end();it++)
        instance.Insert(values[*it]);
    return instance;
}